

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestPackColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int *piVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  Dring *pDVar18;
  fpclass_type *pfVar19;
  
  pCVar1 = &(this->u).col;
  pDVar18 = (this->u).col.list.next;
  piVar12 = (this->u).col.max;
  if ((Col *)pDVar18 == pCVar1) {
    uVar13 = 0;
  }
  else {
    pnVar5 = (this->u).col.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->u).col.idx;
    piVar7 = (this->u).col.len;
    piVar8 = (this->u).col.start;
    uVar15 = 0;
    do {
      iVar2 = pDVar18->idx;
      if (piVar8[iVar2] != (int)uVar15) {
        do {
          iVar2 = pDVar18->idx;
          iVar3 = piVar8[iVar2];
          lVar16 = (long)iVar3;
          piVar8[iVar2] = (int)uVar15;
          iVar4 = piVar7[iVar2];
          piVar12[iVar2] = iVar4;
          if (0 < iVar4) {
            uVar14 = (ulong)(int)uVar15;
            uVar15 = uVar14;
            lVar17 = lVar16;
            pfVar19 = &(pnVar5->m_backend).fpclass;
            do {
              *(undefined8 *)(pfVar19 + uVar14 * 0xe + -4) =
                   *(undefined8 *)(pfVar19 + lVar16 * 0xe + -4);
              uVar9 = *(undefined8 *)(pfVar19 + lVar16 * 0xe + -0xc);
              uVar10 = *(undefined8 *)(pfVar19 + lVar16 * 0xe + -0xc + 2);
              uVar11 = *(undefined8 *)(pfVar19 + lVar16 * 0xe + -8 + 2);
              *(undefined8 *)(pfVar19 + uVar14 * 0xe + -8) =
                   *(undefined8 *)(pfVar19 + lVar16 * 0xe + -8);
              *(undefined8 *)(pfVar19 + uVar14 * 0xe + -8 + 2) = uVar11;
              *(undefined8 *)(pfVar19 + uVar14 * 0xe + -0xc) = uVar9;
              *(undefined8 *)(pfVar19 + uVar14 * 0xe + -0xc + 2) = uVar10;
              pfVar19[uVar14 * 0xe + -2] = pfVar19[lVar16 * 0xe + -2];
              *(char *)(pfVar19 + uVar14 * 0xe + -1) = (char)pfVar19[lVar16 * 0xe + -1];
              *(undefined8 *)(pfVar19 + uVar14 * 0xe) = *(undefined8 *)(pfVar19 + lVar16 * 0xe);
              piVar6[uVar15] = piVar6[lVar17];
              uVar15 = uVar15 + 1;
              lVar17 = lVar17 + 1;
              pfVar19 = pfVar19 + 0xe;
            } while (lVar17 < iVar4 + iVar3);
          }
          uVar13 = (uint)uVar15;
          pDVar18 = pDVar18->next;
        } while ((Col *)pDVar18 != pCVar1);
        piVar12 = (this->u).col.max;
        break;
      }
      iVar3 = piVar7[iVar2];
      uVar13 = (int)uVar15 + iVar3;
      uVar15 = (ulong)uVar13;
      piVar12[iVar2] = iVar3;
      pDVar18 = pDVar18->next;
    } while ((Col *)pDVar18 != pCVar1);
  }
  (this->u).col.used = uVar13;
  piVar12[this->thedim] = 0;
  return;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}